

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void Commands::ReloadQuest
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,Command_Source *from)

{
  int iVar1;
  undefined4 extraout_var;
  long *local_30 [2];
  long local_20 [2];
  
  (*from->_vptr_Command_Source[2])(local_30);
  Console::Out("Quests reloaded by %s",local_30[0]);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  World::ReloadQuests((World *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void ReloadQuest(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Out("Quests reloaded by %s", from->SourceName().c_str());
	from->SourceWorld()->ReloadQuests();
}